

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

qint64 __thiscall
QNetworkReplyHttpImpl::readData(QNetworkReplyHttpImpl *this,char *data,qint64 maxlen)

{
  bool bVar1;
  QNetworkReplyHttpImplPrivate *pQVar2;
  size_t *psVar3;
  qint64 qVar4;
  size_t in_RCX;
  void *in_RDX;
  void *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qint64 wasBuffered;
  qint64 wasBuffered_1;
  qint64 bytesRead;
  qint64 howMuch;
  qint64 ret;
  QNetworkReplyHttpImplPrivate *d;
  QDecompressHelper *in_stack_ffffffffffffff38;
  QNetworkReplyHttpImplPrivate *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff50;
  NetworkError code;
  QNetworkReplyHttpImplPrivate *in_stack_ffffffffffffff58;
  QString *pQVar5;
  QChar fillChar;
  QDecompressHelper *local_70;
  QChar local_62 [13];
  char local_48 [48];
  long local_18;
  void *local_10;
  long local_8;
  
  code = (NetworkError)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  local_10 = in_RDX;
  pQVar2 = d_func((QNetworkReplyHttpImpl *)0x31593d);
  fillChar.ucs = (char16_t)((ulong)pQVar5 >> 0x30);
  if (pQVar2->cacheLoadDevice == (QIODevice *)0x0) {
    if (pQVar2->downloadZerocopyBuffer == (char *)0x0) {
      bVar1 = QDecompressHelper::isValid(&pQVar2->decompressHelper);
      if ((!bVar1) ||
         ((bVar1 = QDecompressHelper::hasData((QDecompressHelper *)in_stack_ffffffffffffff40),
          !bVar1 && (bVar1 = QNetworkReply::isFinished((QNetworkReply *)0x315a5a), bVar1)))) {
        if ((pQVar2->state == Finished) || (pQVar2->state == Aborted)) {
          local_70 = (QDecompressHelper *)0xffffffffffffffff;
        }
        else {
          pQVar2->bytesBuffered = 0;
          qVar4 = QNetworkReply::readBufferSize((QNetworkReply *)0x315c95);
          if (qVar4 != 0) {
            readBufferFreed((QNetworkReplyHttpImpl *)0x315caa,(qint64)in_stack_ffffffffffffff38);
          }
          local_70 = (QDecompressHelper *)0x0;
        }
      }
      else if ((local_10 == (void *)0x0) ||
              (bVar1 = QDecompressHelper::hasData((QDecompressHelper *)in_stack_ffffffffffffff40),
              !bVar1)) {
        local_70 = (QDecompressHelper *)0x0;
      }
      else {
        local_70 = (QDecompressHelper *)
                   QDecompressHelper::read(&pQVar2->decompressHelper,(int)in_RSI,local_10,in_RCX);
        bVar1 = QDecompressHelper::isValid(&pQVar2->decompressHelper);
        if (bVar1) {
          if (pQVar2->cacheSaveDevice != (QIODevice *)0x0) {
            QIODevice::write((char *)pQVar2->cacheSaveDevice,(longlong)in_RSI);
            bVar1 = QNetworkReply::isFinished((QNetworkReply *)0x315bd0);
            if ((bVar1) &&
               (bVar1 = QDecompressHelper::hasData((QDecompressHelper *)in_stack_ffffffffffffff40),
               !bVar1)) {
              QNetworkReplyHttpImplPrivate::completeCacheSave(in_stack_ffffffffffffff40);
            }
          }
          pQVar2->bytesBuffered = 0;
          qVar4 = QNetworkReply::readBufferSize((QNetworkReply *)0x315c22);
          if (qVar4 != 0) {
            readBufferFreed((QNetworkReplyHttpImpl *)0x315c37,(qint64)in_stack_ffffffffffffff38);
          }
        }
        else {
          QCoreApplication::translate(local_48,"QHttp","Decompression failed: %1",0);
          QDecompressHelper::errorString(in_stack_ffffffffffffff38);
          QChar::QChar<char16_t,_true>(local_62,L' ');
          QString::arg<QString,_true>
                    ((QString *)local_70,(QString *)in_stack_ffffffffffffff58,code,fillChar);
          QNetworkReplyHttpImplPrivate::error(in_stack_ffffffffffffff58,code,in_RDI);
          QString::~QString((QString *)0x315b66);
          QString::~QString((QString *)0x315b70);
          QString::~QString((QString *)0x315b7d);
          QDecompressHelper::clear(local_70);
          local_70 = (QDecompressHelper *)0xffffffffffffffff;
        }
      }
    }
    else {
      local_18 = pQVar2->downloadBufferCurrentSize - pQVar2->downloadBufferReadPosition;
      psVar3 = (size_t *)qMin<long_long>((longlong *)&local_10,&local_18);
      local_70 = (QDecompressHelper *)*psVar3;
      memcpy(in_RSI,pQVar2->downloadZerocopyBuffer + pQVar2->downloadBufferReadPosition,
             (size_t)local_70);
      pQVar2->downloadBufferReadPosition =
           (long)&(local_70->compressedDataBuffer).buffers.d.d + pQVar2->downloadBufferReadPosition;
    }
  }
  else {
    local_70 = (QDecompressHelper *)
               QIODevice::read((char *)pQVar2->cacheLoadDevice,(longlong)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (qint64)local_70;
}

Assistant:

qint64 QNetworkReplyHttpImpl::readData(char* data, qint64 maxlen)
{
    Q_D(QNetworkReplyHttpImpl);

    // cacheload device
    if (d->cacheLoadDevice) {
        // FIXME bytesdownloaded, position etc?

        qint64 ret = d->cacheLoadDevice->read(data, maxlen);
        return ret;
    }

    // zerocopy buffer
    if (d->downloadZerocopyBuffer) {
        // FIXME bytesdownloaded, position etc?

        qint64 howMuch = qMin(maxlen, (d->downloadBufferCurrentSize - d->downloadBufferReadPosition));
        memcpy(data, d->downloadZerocopyBuffer + d->downloadBufferReadPosition, howMuch);
        d->downloadBufferReadPosition += howMuch;
        return howMuch;

    }

    if (d->decompressHelper.isValid() && (d->decompressHelper.hasData() || !isFinished())) {
        if (maxlen == 0 || !d->decompressHelper.hasData())
            return 0;
        const qint64 bytesRead = d->decompressHelper.read(data, maxlen);
        if (!d->decompressHelper.isValid()) {
            d->error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                     QCoreApplication::translate("QHttp", "Decompression failed: %1")
                             .arg(d->decompressHelper.errorString()));
            d->decompressHelper.clear();
            return -1;
        }
        if (d->cacheSaveDevice) {
            // Need to write to the cache now that we have the data
            d->cacheSaveDevice->write(data, bytesRead);
            // ... and if we've read everything then the cache can be closed.
            if (isFinished() && !d->decompressHelper.hasData())
                d->completeCacheSave();
        }
        // In case of buffer size restriction we need to emit that it has been emptied
        qint64 wasBuffered = d->bytesBuffered;
        d->bytesBuffered = 0;
        if (readBufferSize())
            emit readBufferFreed(wasBuffered);
        return bytesRead;
    }

    // normal buffer
    if (d->state == d->Finished || d->state == d->Aborted)
        return -1;

    qint64 wasBuffered = d->bytesBuffered;
    d->bytesBuffered = 0;
    if (readBufferSize())
        emit readBufferFreed(wasBuffered);
    return 0;
}